

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O2

int output_new_symbol(byte_t symbol,byte_t *output_buffer,FILE *output_file_ptr)

{
  int iVar1;
  adh_node_t *node;
  bit_array_t bit_array;
  
  memset(&bit_array,0,0x102);
  symbol_to_bits(symbol,&bit_array);
  iVar1 = output_bit_array(&bit_array,output_buffer,output_file_ptr);
  if (iVar1 == 0) {
    node = adh_create_node_and_append((ushort)symbol);
    adh_update_tree(node,true);
  }
  return iVar1;
}

Assistant:

int output_new_symbol(byte_t symbol, byte_t *output_buffer, FILE* output_file_ptr) {
    // write symbol code
    bit_array_t bit_array = {0};
    symbol_to_bits(symbol, &bit_array);

#ifdef _DEBUG
    log_debug("  output_new_symbol", "%s out_bit_idx=%-8d bin=%s\n",
              fmt_symbol(symbol), out_bit_idx,
              fmt_bit_array(&bit_array));
#endif
    int rc = output_bit_array(&bit_array, output_buffer, output_file_ptr);
    if(rc != RC_OK)
        return rc;

    adh_node_t* new_node = adh_create_node_and_append(symbol);
    adh_update_tree(new_node, true);
    return rc;
}